

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

void __thiscall
doctest::detail::
ContextScope<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/reporters/ReporterFactoryTests.cpp:40:9)>
::stringify(ContextScope<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_reporters_ReporterFactoryTests_cpp:40:9)>
            *this,ostream *s)

{
  ostream *in_stack_00000038;
  anon_class_8_1_a38ebfbb_for_lambda_ *in_stack_00000040;
  
  anon_class_8_1_a38ebfbb_for_lambda_::operator()(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void stringify(std::ostream* s) const override { lambda_(s); }